

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

void __thiscall
ON_Annotation::SetLengthFactor(ON_Annotation *this,ON_DimStyle *parent_style,double factor)

{
  bool bCreateIfNull;
  ON_DimStyle *pOVar1;
  double candidate_value;
  ON_DimStyle *override_style;
  bool bCreate;
  double factor_local;
  ON_DimStyle *parent_style_local;
  ON_Annotation *this_local;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  candidate_value = ON_DimStyle::LengthFactor(pOVar1);
  bCreateIfNull = Internal_DimStyleDoubleChanged(factor,candidate_value);
  pOVar1 = Internal_GetOverrideStyle(this,bCreateIfNull);
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetLengthFactor(pOVar1,factor);
    ON_DimStyle::SetFieldOverride(pOVar1,LengthFactor,bCreateIfNull);
  }
  return;
}

Assistant:

void ON_Annotation::SetLengthFactor(const ON_DimStyle* parent_style, double factor)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(factor, parent_style->LengthFactor());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetLengthFactor(factor);
    override_style->SetFieldOverride(ON_DimStyle::field::LengthFactor, bCreate);
  }
}